

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emitLocalSet(Poppifier *this,LocalSet *curr)

{
  Index IVar1;
  ulong uVar2;
  Type TVar3;
  bool bVar4;
  reference pvVar5;
  const_reference pvVar6;
  Type *pTVar7;
  Expression *pEVar8;
  size_t sVar9;
  LocalSet *local_90;
  uintptr_t local_88;
  LocalSet *local_80;
  uintptr_t local_78;
  LocalGet *local_70;
  ulong local_68;
  size_t i_1;
  uintptr_t local_58;
  LocalSet *local_50;
  uintptr_t local_48;
  LocalSet *local_40;
  size_type local_38;
  size_t i;
  mapped_type *elems;
  Type types;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  LocalSet *curr_local;
  Poppifier *this_local;
  
  pvVar5 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  types.id = (uintptr_t)&pvVar5->instrs;
  bVar4 = wasm::Type::isTuple(&curr->value->type);
  if (bVar4) {
    elems = (mapped_type *)
            Function::getLocalType
                      ((this->super_BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>).func,
                       curr->index);
    i = (size_t)std::
                unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[](&this->tupleVars,&curr->index);
    local_38 = wasm::Type::size((Type *)&elems);
    while (TVar3.id = types.id, local_38 = local_38 - 1, local_38 != 0) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i,local_38);
      IVar1 = *pvVar6;
      pTVar7 = wasm::Type::operator[]((Type *)&elems,local_38);
      local_48 = pTVar7->id;
      pEVar8 = (Expression *)Builder::makePop(&this->builder,(Type)local_48);
      local_40 = Builder::makeLocalSet(&this->builder,IVar1,pEVar8);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar3.id,
                 (value_type *)&local_40);
    }
    bVar4 = LocalSet::isTee(curr);
    TVar3 = types;
    if (bVar4) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i,0);
      IVar1 = *pvVar6;
      pTVar7 = wasm::Type::operator[]((Type *)&elems,0);
      local_58 = pTVar7->id;
      pEVar8 = (Expression *)Builder::makePop(&this->builder,(Type)local_58);
      pTVar7 = wasm::Type::operator[]((Type *)&elems,0);
      i_1 = pTVar7->id;
      local_50 = Builder::makeLocalTee(&this->builder,IVar1,pEVar8,(Type)i_1);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar3.id,
                 (value_type *)&local_50);
      for (local_68 = 1; uVar2 = local_68, sVar9 = wasm::Type::size((Type *)&elems), TVar3 = types,
          uVar2 < sVar9; local_68 = local_68 + 1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i,local_68);
        IVar1 = *pvVar6;
        pTVar7 = wasm::Type::operator[]((Type *)&elems,local_68);
        local_78 = pTVar7->id;
        local_70 = Builder::makeLocalGet(&this->builder,IVar1,(Type)local_78);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar3.id,
                   (value_type *)&local_70);
      }
    }
    else {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i,0);
      IVar1 = *pvVar6;
      pTVar7 = wasm::Type::operator[]((Type *)&elems,0);
      local_88 = pTVar7->id;
      pEVar8 = (Expression *)Builder::makePop(&this->builder,(Type)local_88);
      local_80 = Builder::makeLocalSet(&this->builder,IVar1,pEVar8);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar3.id,
                 (value_type *)&local_80);
    }
  }
  else {
    poppify(this,(Expression *)curr);
    local_90 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)types.id,
               (value_type *)&local_90);
  }
  return;
}

Assistant:

void Poppifier::emitLocalSet(LocalSet* curr) {
  auto& instrs = scopeStack.back().instrs;
  if (curr->value->type.isTuple()) {
    auto types = func->getLocalType(curr->index);
    const auto& elems = tupleVars[curr->index];
    // Add the unconditional sets
    for (size_t i = types.size() - 1; i >= 1; --i) {
      instrs.push_back(
        builder.makeLocalSet(elems[i], builder.makePop(types[i])));
    }
    if (curr->isTee()) {
      // Use a tee followed by gets to retrieve the tuple
      instrs.push_back(
        builder.makeLocalTee(elems[0], builder.makePop(types[0]), types[0]));
      for (size_t i = 1; i < types.size(); ++i) {
        instrs.push_back(builder.makeLocalGet(elems[i], types[i]));
      }
    } else {
      // Otherwise just add the last set
      instrs.push_back(
        builder.makeLocalSet(elems[0], builder.makePop(types[0])));
    }
  } else {
    poppify(curr);
    instrs.push_back(curr);
  }
}